

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_vorbis.h
# Opt level: O3

void vorbis_deinit(stb_vorbis *p)

{
  Residue *pRVar1;
  long lVar2;
  bool bVar3;
  int iVar4;
  Codebook *pCVar5;
  bool bVar6;
  void *__ptr;
  long lVar7;
  long lVar8;
  ulong uVar9;
  
  if ((p->alloc).alloc_buffer == (char *)0x0) {
    free(p->vendor);
  }
  iVar4 = p->comment_list_length;
  if (0 < iVar4) {
    lVar8 = 0;
    do {
      if ((p->alloc).alloc_buffer == (char *)0x0) {
        free(p->comment_list[lVar8]);
        iVar4 = p->comment_list_length;
      }
      lVar8 = lVar8 + 1;
    } while (lVar8 < iVar4);
  }
  if ((p->alloc).alloc_buffer == (char *)0x0) {
    free(p->comment_list);
  }
  if ((p->residue_config != (Residue *)0x0) && (0 < p->residue_count)) {
    lVar8 = 0;
    do {
      pRVar1 = p->residue_config;
      if (pRVar1[lVar8].classdata == (uint8 **)0x0) {
LAB_0013ccd4:
        if ((p->alloc).alloc_buffer == (char *)0x0) {
          free(pRVar1[lVar8].residue_books);
        }
      }
      else {
        pCVar5 = p->codebooks;
        uVar9 = (ulong)pRVar1[lVar8].classbook;
        if (0 < pCVar5[uVar9].entries) {
          lVar7 = 0;
          do {
            if ((p->alloc).alloc_buffer == (char *)0x0) {
              free(pRVar1[lVar8].classdata[lVar7]);
              pCVar5 = p->codebooks;
              uVar9 = (ulong)pRVar1[lVar8].classbook;
            }
            lVar7 = lVar7 + 1;
          } while (lVar7 < pCVar5[uVar9].entries);
        }
        if ((p->alloc).alloc_buffer == (char *)0x0) {
          free(pRVar1[lVar8].classdata);
          goto LAB_0013ccd4;
        }
      }
      lVar8 = lVar8 + 1;
    } while (lVar8 < p->residue_count);
  }
  if (p->codebooks != (Codebook *)0x0) {
    if (0 < p->codebook_count) {
      lVar8 = 8;
      lVar7 = 0;
      do {
        if ((p->alloc).alloc_buffer == (char *)0x0) {
          pCVar5 = p->codebooks;
          free(*(void **)((long)pCVar5->fast_huffman + lVar8 + -0x30));
          if ((p->alloc).alloc_buffer == (char *)0x0) {
            free(*(void **)((long)pCVar5->fast_huffman + lVar8 + -0x18));
            if ((p->alloc).alloc_buffer == (char *)0x0) {
              free(*(void **)((long)pCVar5->fast_huffman + lVar8 + -0x10));
              if ((p->alloc).alloc_buffer == (char *)0x0) {
                free(*(void **)((long)pCVar5->fast_huffman + lVar8 + 0x7f8));
                if ((p->alloc).alloc_buffer == (char *)0x0) {
                  lVar2 = *(long *)((long)&pCVar5->sorted_codewords + lVar8);
                  __ptr = (void *)(lVar2 + -4);
                  if (lVar2 == 0) {
                    __ptr = (void *)0x0;
                  }
                  free(__ptr);
                }
              }
            }
          }
        }
        lVar7 = lVar7 + 1;
        lVar8 = lVar8 + 0x848;
      } while (lVar7 < p->codebook_count);
    }
    if ((p->alloc).alloc_buffer != (char *)0x0) goto LAB_0013cdf5;
    free(p->codebooks);
  }
  if ((p->alloc).alloc_buffer == (char *)0x0) {
    free(p->floor_config);
    if ((p->alloc).alloc_buffer == (char *)0x0) {
      free(p->residue_config);
    }
  }
LAB_0013cdf5:
  if (p->mapping != (Mapping *)0x0) {
    iVar4 = p->mapping_count;
    if (0 < iVar4) {
      lVar8 = 8;
      lVar7 = 0;
      do {
        if ((p->alloc).alloc_buffer == (char *)0x0) {
          free(*(void **)(p->mapping->submap_floor + lVar8 + -0x11));
          iVar4 = p->mapping_count;
        }
        lVar7 = lVar7 + 1;
        lVar8 = lVar8 + 0x30;
      } while (lVar7 < iVar4);
    }
    if ((p->alloc).alloc_buffer == (char *)0x0) {
      free(p->mapping);
    }
  }
  if (0 < p->channels) {
    uVar9 = 0;
    do {
      if ((p->alloc).alloc_buffer == (char *)0x0) {
        free(p->channel_buffers[uVar9]);
        if ((p->alloc).alloc_buffer == (char *)0x0) {
          free(p->previous_window[uVar9]);
          if ((p->alloc).alloc_buffer == (char *)0x0) {
            free(p->finalY[uVar9]);
          }
        }
      }
    } while ((uVar9 < 0xf) && (uVar9 = uVar9 + 1, (long)uVar9 < (long)p->channels));
  }
  lVar8 = 0;
  bVar3 = true;
  do {
    bVar6 = bVar3;
    if ((p->alloc).alloc_buffer == (char *)0x0) {
      free(p->A[lVar8]);
      if ((p->alloc).alloc_buffer == (char *)0x0) {
        free(p->B[lVar8]);
        if ((p->alloc).alloc_buffer == (char *)0x0) {
          free(p->C[lVar8]);
          if ((p->alloc).alloc_buffer == (char *)0x0) {
            free(p->window[lVar8]);
            if ((p->alloc).alloc_buffer == (char *)0x0) {
              free(p->bit_reverse[lVar8]);
            }
          }
        }
      }
    }
    lVar8 = 1;
    bVar3 = false;
  } while (bVar6);
  if (p->close_on_free != 0) {
    fclose((FILE *)p->f);
    return;
  }
  return;
}

Assistant:

static void vorbis_deinit(stb_vorbis *p)
{
   int i,j;

   setup_free(p, p->vendor);
   for (i=0; i < p->comment_list_length; ++i) {
      setup_free(p, p->comment_list[i]);
   }
   setup_free(p, p->comment_list);

   if (p->residue_config) {
      for (i=0; i < p->residue_count; ++i) {
         Residue *r = p->residue_config+i;
         if (r->classdata) {
            for (j=0; j < p->codebooks[r->classbook].entries; ++j)
               setup_free(p, r->classdata[j]);
            setup_free(p, r->classdata);
         }
         setup_free(p, r->residue_books);
      }
   }

   if (p->codebooks) {
      CHECK(p);
      for (i=0; i < p->codebook_count; ++i) {
         Codebook *c = p->codebooks + i;
         setup_free(p, c->codeword_lengths);
         setup_free(p, c->multiplicands);
         setup_free(p, c->codewords);
         setup_free(p, c->sorted_codewords);
         // c->sorted_values[-1] is the first entry in the array
         setup_free(p, c->sorted_values ? c->sorted_values-1 : NULL);
      }
      setup_free(p, p->codebooks);
   }
   setup_free(p, p->floor_config);
   setup_free(p, p->residue_config);
   if (p->mapping) {
      for (i=0; i < p->mapping_count; ++i)
         setup_free(p, p->mapping[i].chan);
      setup_free(p, p->mapping);
   }
   CHECK(p);
   for (i=0; i < p->channels && i < STB_VORBIS_MAX_CHANNELS; ++i) {
      setup_free(p, p->channel_buffers[i]);
      setup_free(p, p->previous_window[i]);
      #ifdef STB_VORBIS_NO_DEFER_FLOOR
      setup_free(p, p->floor_buffers[i]);
      #endif
      setup_free(p, p->finalY[i]);
   }
   for (i=0; i < 2; ++i) {
      setup_free(p, p->A[i]);
      setup_free(p, p->B[i]);
      setup_free(p, p->C[i]);
      setup_free(p, p->window[i]);
      setup_free(p, p->bit_reverse[i]);
   }
   #ifndef STB_VORBIS_NO_STDIO
   if (p->close_on_free) fclose(p->f);
   #endif
}